

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall
mp::NLFeeder_Easy::FeedRowAndObjNames<mp::StringFileWriter>
          (NLFeeder_Easy *this,StringFileWriter *wrt)

{
  long lVar1;
  bool bVar2;
  
  if ((this->nlme_).row_names_ != (char **)0x0) {
    if (wrt->fTriedOpen_ == false) {
      bVar2 = StringFileWriter::Open(wrt);
    }
    else {
      bVar2 = (wrt->nm).f_ != (FILE *)0x0;
    }
    if (bVar2 != false) {
      if (0 < (this->nlme_).num_row_) {
        lVar1 = 0;
        do {
          StringFileWriter::Write<char_const*>(wrt,(this->nlme_).row_names_[lVar1]);
          lVar1 = lVar1 + 1;
        } while (lVar1 < (this->nlme_).num_row_);
      }
      StringFileWriter::Write<char_const*>(wrt,(this->nlme_).obj_name_);
      return;
    }
  }
  return;
}

Assistant:

void FeedRowAndObjNames(RowObjNameWriter& wrt) {
    if (NLME().RowNames() && wrt) {
      for (int i=0; i<NLME().NumRows(); ++i)
        wrt << NLME().RowNames()[i];
      wrt << NLME().ObjName();
    }
  }